

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  U32 minMatch_00;
  ZSTD_strategy strat;
  ZSTD_dictMode_e dictMode;
  ZSTD_blockCompressor p_Var1;
  ulong uVar2;
  size_t sVar3;
  rawSeq rVar4;
  size_t newLitLength;
  int i;
  uint local_80;
  U32 local_74;
  uint uStack_70;
  rawSeq sequence;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  ZSTD_blockCompressor blockCompressor;
  uint minMatch;
  ZSTD_compressionParameters *cParams;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  rawSeqStore_t *rawSeqStore_local;
  
  minMatch_00 = (ms->cParams).minMatch;
  strat = (ms->cParams).strategy;
  dictMode = ZSTD_matchState_dictMode(ms);
  p_Var1 = ZSTD_selectBlockCompressor(strat,dictMode);
  uVar2 = (long)src + srcSize;
  for (sequence._4_8_ = src; rawSeqStore->pos < rawSeqStore->size && (ulong)sequence._4_8_ < uVar2;
      sequence._4_8_ = sequence._4_8_ + (ulong)uStack_70 + (ulong)local_80) {
    ip._0_4_ = (int)uVar2;
    rVar4 = maybeSplitSequence(rawSeqStore,(int)ip - sequence.litLength,minMatch_00);
    local_80 = rVar4.matchLength;
    local_74 = rVar4.offset;
    if (local_74 == 0) break;
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)sequence._4_8_);
    ZSTD_ldm_fillFastTables(ms,(void *)sequence._4_8_);
    uStack_70 = rVar4.litLength;
    sVar3 = (*p_Var1)(ms,seqStore,rep,(void *)sequence._4_8_,rVar4._4_8_);
    for (newLitLength._4_4_ = 2; 0 < newLitLength._4_4_;
        newLitLength._4_4_ = newLitLength._4_4_ + -1) {
      rep[newLitLength._4_4_] = rep[newLitLength._4_4_ + -1];
    }
    *rep = local_74;
    ZSTD_storeSeq(seqStore,sVar3,(void *)((sequence._4_8_ + (ulong)uStack_70) - sVar3),local_74 + 2,
                  (ulong)(local_80 - 3));
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)sequence._4_8_);
  ZSTD_ldm_fillFastTables(ms,(void *)sequence._4_8_);
  sVar3 = (*p_Var1)(ms,seqStore,rep,(void *)sequence._4_8_,uVar2 - sequence._4_8_);
  return sVar3;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}